

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

void inproc_queue_run_closed(inproc_queue *queue)

{
  nni_aio *aio;
  
  do {
    aio = (nni_aio *)nni_list_first(&queue->readers);
    if (aio == (nni_aio *)0x0) {
      aio = (nni_aio *)nni_list_first(&queue->writers);
      if (aio == (nni_aio *)0x0) {
        return;
      }
    }
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  } while( true );
}

Assistant:

static void
inproc_queue_run_closed(inproc_queue *queue)
{
	nni_aio *aio;
	while (((aio = nni_list_first(&queue->readers)) != NULL) ||
	    ((aio = nni_list_first(&queue->writers)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
}